

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto2_unittest.pb.h
# Opt level: O0

TestMaps * __thiscall
proto2_unittest::TestSubmessageMaps::_internal_mutable_m(TestSubmessageMaps *this)

{
  Arena *arena;
  TestMaps *pTVar1;
  TestMaps *p;
  TestSubmessageMaps *this_local;
  
  if ((this->field_0)._impl_.m_ == (TestMaps *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestMaps *)google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestMaps>(arena)
    ;
    (this->field_0)._impl_.m_ = pTVar1;
  }
  return (this->field_0)._impl_.m_;
}

Assistant:

inline ::proto2_unittest::TestMaps* PROTOBUF_NONNULL TestSubmessageMaps::_internal_mutable_m() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.m_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMaps>(GetArena());
    _impl_.m_ = reinterpret_cast<::proto2_unittest::TestMaps*>(p);
  }
  return _impl_.m_;
}